

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8toUtf16(char *src,uint srclen,unsigned_short *dst,uint dstlen)

{
  uint uVar1;
  wchar_t local_50;
  uint ucs_1;
  wchar_t len_1;
  uint ucs;
  wchar_t len;
  uint count;
  char *e;
  char *p;
  unsigned_short *puStack_28;
  uint dstlen_local;
  unsigned_short *dst_local;
  char *pcStack_18;
  uint srclen_local;
  char *src_local;
  
  _len = src + srclen;
  ucs = 0;
  uVar1 = ucs;
  e = src;
  p._4_4_ = dstlen;
  puStack_28 = dst;
  dst_local._4_4_ = srclen;
  pcStack_18 = src;
  if (dstlen != 0) {
    do {
      ucs = uVar1;
      if (_len <= e) {
        puStack_28[ucs] = 0;
        return ucs;
      }
      if (((int)*e & 0x80U) == 0) {
        puStack_28[ucs] = (short)*e;
        e = e + 1;
      }
      else {
        ucs_1 = fl_utf8decode(e,_len,&len_1);
        e = e + len_1;
        if (ucs_1 < 0x10000) {
          puStack_28[ucs] = (ushort)ucs_1;
        }
        else {
          if (p._4_4_ <= ucs + 2) {
            puStack_28[ucs] = 0;
            ucs = ucs + 2;
            goto LAB_00262a3e;
          }
          puStack_28[ucs] = (ushort)(ucs_1 - 0x10000 >> 10) & 0x3ff | 0xd800;
          ucs = ucs + 1;
          puStack_28[ucs] = (ushort)ucs_1 & 0x3ff | 0xdc00;
        }
      }
      uVar1 = ucs + 1;
    } while (uVar1 != p._4_4_);
    puStack_28[ucs] = 0;
    ucs = uVar1;
  }
LAB_00262a3e:
  while (e < _len) {
    if (((int)*e & 0x80U) == 0) {
      e = e + 1;
    }
    else {
      uVar1 = fl_utf8decode(e,_len,&local_50);
      e = e + local_50;
      if (0xffff < uVar1) {
        ucs = ucs + 1;
      }
    }
    ucs = ucs + 1;
  }
  return ucs;
}

Assistant:

unsigned fl_utf8toUtf16(const char* src, unsigned srclen,
		  unsigned short* dst, unsigned dstlen)
{
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    if (p >= e) {dst[count] = 0; return count;}
    if (!(*p & 0x80)) { /* ascii */
      dst[count] = *p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs < 0x10000) {
	dst[count] = ucs;
      } else {
	/* make a surrogate pair: */
	if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
	dst[count] = (((ucs-0x10000u)>>10)&0x3ff) | 0xd800;
	dst[++count] = (ucs&0x3ff) | 0xdc00;
      }
    }
    if (++count == dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs >= 0x10000) ++count;
    }
    ++count;
  }
  return count;
}